

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O0

void __thiscall
ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
unsubscribe(Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            *this)

{
  bool bVar1;
  reference ppVar2;
  element_type *this_00;
  pair<const_unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  *topic;
  iterator __end0;
  iterator __begin0;
  map<unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
  *__range2;
  lock_guard<std::mutex> l;
  Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *this_local;
  
  l._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range2,&this->m);
  __end0 = std::
           map<unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
           ::begin(&this->topics);
  topic = (pair<const_unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
           *)std::
             map<unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
             ::end(&this->topics);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&topic);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
             ::operator*(&__end0);
    this_00 = std::
              __shared_ptr_access<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ppVar2->second);
    Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
    unsubscribe(this_00,this);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
    ::operator++(&__end0);
  }
  std::
  map<unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
  ::clear(&this->topics);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2);
  return;
}

Assistant:

void unsubscribe()
		{
			std::lock_guard<std::mutex> l{m};
			for (const auto& topic : topics)
				topic.second->unsubscribe(this);
			topics.clear();
		}